

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O1

void Lpk_IfManStart(Lpk_Man_t *p)

{
  If_Par_t *pPars;
  If_Man_t *p_00;
  float *pfVar1;
  
  if (p->pIfMan == (If_Man_t *)0x0) {
    pPars = (If_Par_t *)malloc(0x150);
    memset(pPars,0,0x150);
    pPars->nLutSize = p->pPars->nLutSize;
    pPars->nCutsMax = 0x10;
    pPars->nFlowIters = 0;
    pPars->nAreaIters = 0;
    pPars->DelayTarget = -1.0;
    pPars->Epsilon = 0.005;
    pPars->fPreprocess = 0;
    pPars->fArea = 1;
    pPars->fFancy = 0;
    pPars->fExpRed = 0;
    pPars->fLatchPaths = 0;
    pPars->fVerbose = 0;
    pPars->fTruth = 1;
    pPars->fUsePerm = 0;
    pPars->fUseBdds = 0;
    pPars->fUseSops = 0;
    pPars->fUseCnfs = 0;
    pPars->fUseCnfs = 0;
    pPars->fUseMv = 0;
    pPars->nLatchesCi = 0;
    pPars->nLatchesCo = 0;
    pPars->pLutLib = (If_LibLut_t *)0x0;
    pPars->pTimesArr = (float *)0x0;
    p_00 = If_ManStart(pPars);
    p->pIfMan = p_00;
    If_ManSetupSetAll(p_00,1000);
    pfVar1 = (float *)malloc(0x80);
    p->pIfMan->pPars->pTimesArr = pfVar1;
    return;
  }
  __assert_fail("p->pIfMan == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCore.c"
                ,0x7e,"void Lpk_IfManStart(Lpk_Man_t *)");
}

Assistant:

void Lpk_IfManStart( Lpk_Man_t * p )
{
    If_Par_t * pPars;
    assert( p->pIfMan == NULL );
    // set defaults
    pPars = ABC_ALLOC( If_Par_t, 1 );
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  p->pPars->nLutSize;
    pPars->nCutsMax    = 16;
    pPars->nFlowIters  =  0; // 1
    pPars->nAreaIters  =  0; // 1 
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fPreprocess =  0;
    pPars->fArea       =  1;
    pPars->fFancy      =  0;
    pPars->fExpRed     =  0; //
    pPars->fLatchPaths =  0;
    pPars->fVerbose    =  0;
    // internal parameters
    pPars->fTruth      =  1;
    pPars->fUsePerm    =  0; 
    pPars->nLatchesCi  =  0;
    pPars->nLatchesCo  =  0;
    pPars->pLutLib     =  NULL; // Abc_FrameReadLibLut();
    pPars->pTimesArr   =  NULL; 
    pPars->pTimesArr   =  NULL;   
    pPars->fUseBdds    =  0;
    pPars->fUseSops    =  0;
    pPars->fUseCnfs    =  0;
    pPars->fUseMv      =  0;
    // start the mapping manager and set its parameters
    p->pIfMan = If_ManStart( pPars );
    If_ManSetupSetAll( p->pIfMan, 1000 );
    p->pIfMan->pPars->pTimesArr = ABC_ALLOC( float, 32 );
}